

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::ThreadGroup::run(TestStatus *__return_storage_ptr__,ThreadGroup *this)

{
  ThreadGroupThread *pTVar1;
  pointer pcVar2;
  TestStatus *pTVar3;
  qpTestResult qVar4;
  pointer pSVar5;
  ResultCollector resultCollector;
  string local_a8;
  TestStatus *local_88;
  ResultCollector local_80;
  
  tcu::ResultCollector::ResultCollector(&local_80);
  de::SpinBarrier::reset
            (&this->m_barrier,
             (deUint32)
             ((ulong)((long)(this->m_threads).
                            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_threads).
                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4));
  for (pSVar5 = (this->m_threads).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 != (this->m_threads).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar5 = pSVar5 + 1) {
    pTVar1 = pSVar5->m_ptr;
    pTVar1->m_barrier = &this->m_barrier;
    de::Thread::start(&pTVar1->super_Thread);
  }
  pSVar5 = (this->m_threads).
           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88 = __return_storage_ptr__;
  if (pSVar5 != (this->m_threads).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pTVar1 = pSVar5->m_ptr;
      de::Thread::join(&pTVar1->super_Thread);
      qVar4 = tcu::ResultCollector::getResult(&pTVar1->m_resultCollector);
      pcVar2 = (pTVar1->m_resultCollector).m_message._M_dataplus._M_p;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,
                 pcVar2 + (pTVar1->m_resultCollector).m_message._M_string_length);
      tcu::ResultCollector::addResult(&local_80,qVar4,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != (this->m_threads).
                       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  qVar4 = tcu::ResultCollector::getResult(&local_80);
  pTVar3 = local_88;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_80.m_message._M_dataplus._M_p,
             local_80.m_message._M_dataplus._M_p + local_80.m_message._M_string_length);
  pTVar3->m_code = qVar4;
  (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar3->m_description,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus ThreadGroup::run (void)
{
	tcu::ResultCollector	resultCollector;

	m_barrier.reset((int)m_threads.size());

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
		(*threadIter)->start(&m_barrier);

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
	{
		tcu::ResultCollector&	threadResult	= (*threadIter)->getResultCollector();
		(*threadIter)->join();
		resultCollector.addResult(threadResult.getResult(), threadResult.getMessage());
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}